

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes SzDecodeCopy(UInt64 inSize,ILookInStream *inStream,Byte *outBuffer)

{
  int iVar1;
  int __result___1;
  int __result__;
  size_t curSize;
  void *inBuf;
  Byte *outBuffer_local;
  ILookInStream *inStream_local;
  UInt64 inSize_local;
  
  inBuf = outBuffer;
  outBuffer_local = (Byte *)inStream;
  inStream_local = (ILookInStream *)inSize;
  do {
    if (inStream_local == (ILookInStream *)0x0) {
      return 0;
    }
    ___result___1 = (ILookInStream *)0x40000;
    if (inStream_local < (ILookInStream *)0x40000) {
      ___result___1 = inStream_local;
    }
    iVar1 = (**(code **)outBuffer_local)(outBuffer_local,&curSize,&__result___1);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (___result___1 == (ILookInStream *)0x0) {
      return 6;
    }
    memcpy(inBuf,(void *)curSize,(size_t)___result___1);
    inBuf = (void *)((long)&___result___1->Look + (long)inBuf);
    inStream_local = (ILookInStream *)((long)inStream_local - (long)___result___1);
    iVar1 = (**(code **)(outBuffer_local + 8))(outBuffer_local,___result___1);
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

static SRes SzDecodeCopy(UInt64 inSize, ILookInStream *inStream, Byte *outBuffer)
{
  while (inSize > 0)
  {
    const void *inBuf;
    size_t curSize = (1 << 18);
    if (curSize > inSize)
      curSize = (size_t)inSize;
    RINOK(inStream->Look(inStream, &inBuf, &curSize));
    if (curSize == 0)
      return SZ_ERROR_INPUT_EOF;
    memcpy(outBuffer, inBuf, curSize);
    outBuffer += curSize;
    inSize -= curSize;
    RINOK(inStream->Skip((void *)inStream, curSize));
  }
  return SZ_OK;
}